

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

QList<QSsl::SupportedFeature> * QSslSocket::supportedFeatures(QString *backendName)

{
  long lVar1;
  qsizetype qVar2;
  QString *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString *in_stack_ffffffffffffffb8;
  QString *backendName_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  backendName_00 = in_RDI;
  qVar2 = QString::size(in_RSI);
  if (qVar2 == 0) {
    activeBackend();
  }
  else {
    QString::QString(in_RDI,in_stack_ffffffffffffffb8);
  }
  QTlsBackend::supportedFeatures(backendName_00);
  QString::~QString((QString *)0x3a4264);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QList<QSsl::SupportedFeature> *)backendName_00;
  }
  __stack_chk_fail();
}

Assistant:

QList<QSsl::SupportedFeature> QSslSocket::supportedFeatures(const QString &backendName)
{
    return QTlsBackend::supportedFeatures(backendName.size() ? backendName : activeBackend());
}